

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grad-check.cc
# Opt level: O1

bool cnn::CheckGrad(Model *m,ComputationGraph *g,int verbosity)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ComputationGraph *pCVar8;
  uint uVar9;
  long *plVar10;
  ostream *poVar11;
  Tensor *pTVar12;
  Model *pMVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  undefined8 *puVar17;
  char *pcVar18;
  int iVar19;
  Tensor *pTVar20;
  Tensor *pTVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar34;
  real rVar35;
  undefined1 auVar36 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  char local_9a [2];
  Tensor *local_98;
  double local_90;
  undefined1 local_88 [16];
  long *local_70;
  undefined1 local_68 [16];
  Model *local_58;
  long *local_50;
  Tensor *local_48;
  ComputationGraph *local_40;
  Model *local_38;
  
  puVar1 = *(undefined8 **)(m + 0x20);
  local_40 = g;
  for (puVar17 = *(undefined8 **)(m + 0x18); puVar17 != puVar1; puVar17 = puVar17 + 1) {
    Parameters::clear((Parameters *)*puVar17);
  }
  puVar1 = *(undefined8 **)(m + 0x38);
  for (puVar17 = *(undefined8 **)(m + 0x30); pCVar8 = local_40, puVar17 != puVar1;
      puVar17 = puVar17 + 1) {
    LookupParameters::clear((LookupParameters *)*puVar17);
  }
  ComputationGraph::forward(local_40);
  ComputationGraph::backward(pCVar8);
  plVar10 = *(long **)(m + 0x18);
  local_70 = *(long **)(m + 0x20);
  local_58 = m;
  if (plVar10 == local_70) {
    bVar24 = 0;
    bVar22 = false;
    bVar23 = false;
  }
  else {
    bVar22 = false;
    bVar23 = false;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    bVar24 = 0;
    do {
      lVar16 = *plVar10;
      local_50 = plVar10;
      if (1 < verbosity) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"PARAMETERS ",0xb);
        poVar11 = std::ostream::_M_insert<void_const*>(poVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      }
      if ((ulong)*(uint *)(lVar16 + 0x24) == 0) {
        iVar19 = 1;
      }
      else {
        auVar29 = vpbroadcastq_avx512f();
        uVar15 = 0;
        auVar30 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar31 = vmovdqa64_avx512f(auVar30);
          auVar30 = vpbroadcastq_avx512f();
          auVar32 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar32,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar25 = CONCAT11(bVar7,bVar6);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar16 + 8 + uVar15 * 4));
          auVar32._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar30._4_4_;
          auVar32._0_4_ = (uint)(bVar6 & 1) * auVar30._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar30._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar30._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar30._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar30._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar30._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar30._28_4_;
          auVar32._32_4_ = (uint)(bVar7 & 1) * auVar30._32_4_;
          auVar32._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar30._36_4_;
          auVar32._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar30._40_4_;
          auVar32._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar30._44_4_;
          auVar32._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar30._48_4_;
          auVar32._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar30._52_4_;
          auVar32._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar30._56_4_;
          auVar32._60_4_ = (uint)(bVar7 >> 7) * auVar30._60_4_;
          auVar30 = vpmulld_avx512f(auVar32,auVar31);
          uVar15 = uVar15 + 0x10;
        } while (((ulong)*(uint *)(lVar16 + 0x24) + 0xf & 0x1fffffff0) != uVar15);
        auVar27 = vmovdqa32_avx512f(auVar30);
        auVar28._0_4_ = (uint)(bVar6 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar2 * auVar27._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar2 * auVar27._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar2 * auVar27._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar25 >> 7) & 1);
        auVar28._28_4_ = (uint)bVar2 * auVar27._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar28._32_4_ =
             (uint)(bVar7 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar28._36_4_ = (uint)bVar2 * auVar27._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar28._40_4_ = (uint)bVar2 * auVar27._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar28._44_4_ = (uint)bVar2 * auVar27._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar28._48_4_ = (uint)bVar2 * auVar27._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar28._52_4_ = (uint)bVar2 * auVar27._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar28._56_4_ = (uint)bVar2 * auVar27._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar28._60_4_ =
             (uint)(bVar7 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar26 = vextracti64x4_avx512f(auVar28,1);
        auVar27 = vpmulld_avx512f(auVar28,ZEXT3264(auVar26));
        auVar3 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar19 = auVar3._0_4_;
      }
      uVar9 = iVar19 * *(int *)(lVar16 + 0x28);
      if (uVar9 != 0) {
        pTVar20 = (Tensor *)(lVar16 + 0x30);
        local_98 = (Tensor *)(lVar16 + 0x78);
        pTVar21 = (Tensor *)0x0;
        local_48 = (Tensor *)(ulong)uVar9;
        do {
          iVar19 = (int)pTVar21;
          fVar34 = TensorTools::AccessElement(pTVar20,iVar19);
          local_88._0_4_ = fVar34;
          TensorTools::SetElement(pTVar20,iVar19,fVar34 + -0.0005);
          pCVar8 = local_40;
          pTVar12 = ComputationGraph::forward(local_40);
          rVar35 = as_scalar(pTVar12);
          local_68._0_4_ = rVar35;
          TensorTools::SetElement(pTVar20,iVar19,(float)local_88._0_4_ + 0.0005);
          pTVar12 = ComputationGraph::forward(pCVar8);
          rVar35 = as_scalar(pTVar12);
          local_90 = (double)CONCAT44(local_90._4_4_,rVar35);
          TensorTools::SetElement(pTVar20,iVar19,(float)local_88._0_4_);
          local_88 = ZEXT416((uint)((local_90._0_4_ - (float)local_68._0_4_) * 999.99994));
          auVar27._0_4_ = TensorTools::AccessElement(local_98,iVar19);
          auVar27._4_60_ = extraout_var;
          auVar38._8_4_ = 0x7fffffff;
          auVar38._0_8_ = 0x7fffffff7fffffff;
          auVar38._12_4_ = 0x7fffffff;
          auVar3 = vandps_avx(ZEXT416((uint)(local_88._0_4_ - auVar27._0_4_)),auVar38);
          auVar4 = vandps_avx(local_88,auVar38);
          auVar36 = auVar27._0_16_;
          auVar38 = vandps_avx(auVar36,auVar38);
          auVar4 = vmaxss_avx(auVar38,auVar4);
          fVar40 = auVar3._0_4_;
          fVar34 = auVar4._0_4_;
          dVar37 = (double)(fVar40 / (float)((uint)(0.1 < fVar40) *
                                             ((uint)(0.0 < fVar34) * (int)fVar34 +
                                             (uint)(0.0 >= fVar34) * 0x3f800000) +
                                            (uint)(0.1 >= fVar40) * 0x3f800000));
          if (0.1 < dVar37) {
            bVar22 = true;
            bVar23 = true;
          }
          if (0.1 < dVar37 && 0 < verbosity) {
            local_90 = dVar37;
            local_68 = auVar36;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"***[",4);
            poVar11 = std::ostream::_M_insert<double>(local_90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
            bVar24 = 1;
            bVar22 = true;
            bVar23 = true;
            auVar36 = local_68;
          }
          if (1 < (int)((uint)bVar24 + verbosity)) {
            poVar11 = std::ostream::_M_insert<double>((double)auVar36._0_4_);
            local_9a[0] = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_9a,1);
            poVar11 = std::ostream::_M_insert<double>((double)(float)local_88._0_4_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            bVar24 = 0;
          }
          pTVar21 = (Tensor *)((long)(pTVar21->d).d + 1);
        } while (local_48 != pTVar21);
      }
      plVar10 = local_50 + 1;
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (plVar10 != local_70);
  }
  pMVar13 = *(Model **)(local_58 + 0x30);
  local_38 = *(Model **)(local_58 + 0x38);
  if (pMVar13 != local_38) {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      plVar10 = *(long **)pMVar13;
      local_70 = plVar10;
      local_58 = pMVar13;
      if (1 < verbosity) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"LOOKUP PARAMETERS ",0x12);
        poVar11 = std::ostream::_M_insert<void_const*>(poVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        plVar10 = local_70;
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      }
      if ((ulong)*(uint *)((long)plVar10 + 0x24) == 0) {
        local_98 = (Tensor *)0x1;
      }
      else {
        auVar29 = vpbroadcastq_avx512f();
        uVar15 = 0;
        auVar30 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar31 = vmovdqa64_avx512f(auVar30);
          auVar30 = vpbroadcastq_avx512f();
          auVar32 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar32,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar25 = CONCAT11(bVar7,bVar6);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)(plVar10 + 1) + uVar15 * 4));
          auVar33._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar30._4_4_;
          auVar33._0_4_ = (uint)(bVar6 & 1) * auVar30._0_4_;
          auVar33._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar30._8_4_;
          auVar33._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar30._12_4_;
          auVar33._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar30._16_4_;
          auVar33._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar30._20_4_;
          auVar33._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar30._24_4_;
          auVar33._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar30._28_4_;
          auVar33._32_4_ = (uint)(bVar7 & 1) * auVar30._32_4_;
          auVar33._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar30._36_4_;
          auVar33._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar30._40_4_;
          auVar33._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar30._44_4_;
          auVar33._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar30._48_4_;
          auVar33._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar30._52_4_;
          auVar33._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar30._56_4_;
          auVar33._60_4_ = (uint)(bVar7 >> 7) * auVar30._60_4_;
          auVar30 = vpmulld_avx512f(auVar33,auVar31);
          uVar15 = uVar15 + 0x10;
        } while (((ulong)*(uint *)((long)plVar10 + 0x24) + 0xf & 0x1fffffff0) != uVar15);
        auVar27 = vmovdqa32_avx512f(auVar30);
        auVar29._0_4_ = (uint)(bVar6 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar29._16_4_ = (uint)bVar2 * auVar27._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar29._20_4_ = (uint)bVar2 * auVar27._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar29._24_4_ = (uint)bVar2 * auVar27._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar25 >> 7) & 1);
        auVar29._28_4_ = (uint)bVar2 * auVar27._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar29._32_4_ =
             (uint)(bVar7 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar29._36_4_ = (uint)bVar2 * auVar27._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar29._40_4_ = (uint)bVar2 * auVar27._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar29._44_4_ = (uint)bVar2 * auVar27._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar29._48_4_ = (uint)bVar2 * auVar27._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar29._52_4_ = (uint)bVar2 * auVar27._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar29._56_4_ = (uint)bVar2 * auVar27._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar29._60_4_ =
             (uint)(bVar7 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar26 = vextracti64x4_avx512f(auVar29,1);
        auVar27 = vpmulld_avx512f(auVar29,ZEXT3264(auVar26));
        auVar3 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        local_98 = (Tensor *)CONCAT44((int)((ulong)(plVar10 + 1) >> 0x20),auVar3._0_4_);
      }
      plVar14 = (long *)plVar10[0xe];
      if (plVar14 != (long *)0x0) {
        local_98 = (Tensor *)(ulong)(uint)((int)local_98 * (int)plVar10[5]);
        do {
          uVar9 = *(uint *)(plVar14 + 1);
          local_50 = plVar14;
          if (1 < verbosity) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OBJECT=",7);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          if ((int)local_98 != 0) {
            pTVar21 = (Tensor *)(local_70[6] + (ulong)uVar9 * 0x48);
            local_48 = (Tensor *)((ulong)uVar9 * 0x48 + local_70[9]);
            pTVar20 = (Tensor *)0x0;
            bVar23 = bVar22;
            do {
              iVar19 = (int)pTVar20;
              fVar34 = TensorTools::AccessElement(pTVar21,iVar19);
              local_88._0_4_ = fVar34;
              TensorTools::SetElement(pTVar21,iVar19,fVar34 + -0.0005);
              pCVar8 = local_40;
              pTVar12 = ComputationGraph::forward(local_40);
              rVar35 = as_scalar(pTVar12);
              local_68._0_4_ = rVar35;
              TensorTools::SetElement(pTVar21,iVar19,(float)local_88._0_4_ + 0.0005);
              pTVar12 = ComputationGraph::forward(pCVar8);
              rVar35 = as_scalar(pTVar12);
              local_90 = (double)CONCAT44(local_90._4_4_,rVar35);
              TensorTools::SetElement(pTVar21,iVar19,(float)local_88._0_4_);
              local_88 = ZEXT416((uint)((local_90._0_4_ - (float)local_68._0_4_) * 999.99994));
              auVar30._0_4_ = TensorTools::AccessElement(local_48,iVar19);
              auVar30._4_60_ = extraout_var_00;
              auVar39._8_4_ = 0x7fffffff;
              auVar39._0_8_ = 0x7fffffff7fffffff;
              auVar39._12_4_ = 0x7fffffff;
              auVar3 = vandps_avx(ZEXT416((uint)(local_88._0_4_ - auVar30._0_4_)),auVar39);
              auVar4 = vandps_avx(local_88,auVar39);
              auVar36 = auVar30._0_16_;
              auVar38 = vandps_avx(auVar36,auVar39);
              auVar4 = vmaxss_avx(auVar38,auVar4);
              fVar40 = auVar3._0_4_;
              fVar34 = auVar4._0_4_;
              dVar37 = (double)(fVar40 / (float)((uint)(0.1 < fVar40) *
                                                 ((uint)(0.0 < fVar34) * (int)fVar34 +
                                                 (uint)(0.0 >= fVar34) * 0x3f800000) +
                                                (uint)(0.1 >= fVar40) * 0x3f800000));
              if (0.1 < dVar37) {
                bVar23 = true;
              }
              if (0.1 < dVar37 && 0 < verbosity) {
                local_90 = dVar37;
                local_68 = auVar36;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"***[",4);
                poVar11 = std::ostream::_M_insert<double>(local_90);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
                bVar24 = 1;
                bVar23 = true;
                auVar36 = local_68;
              }
              if (1 < (int)((uint)bVar24 + verbosity)) {
                poVar11 = std::ostream::_M_insert<double>((double)auVar36._0_4_);
                local_9a[1] = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_9a + 1,1);
                poVar11 = std::ostream::_M_insert<double>((double)(float)local_88._0_4_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                bVar24 = 0;
              }
              pTVar20 = (Tensor *)((long)(pTVar20->d).d + 1);
              bVar22 = bVar23;
            } while (local_98 != pTVar20);
          }
          plVar14 = (long *)*local_50;
        } while (plVar14 != (long *)0x0);
      }
      pMVar13 = local_58 + 8;
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (pMVar13 != local_38);
  }
  if (bVar23) {
    if (verbosity < 2) goto LAB_0018955d;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar11 = (ostream *)std::ostream::flush();
    pcVar18 = "*** GRADIENT CHECK FAILED ***";
    lVar16 = 0x1d;
  }
  else {
    if (verbosity < 1) goto LAB_0018955d;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar11 = (ostream *)std::ostream::flush();
    pcVar18 = "GRADIENT CHECK PASSED";
    lVar16 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar18,lVar16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
LAB_0018955d:
  return (bool)~bVar23;
}

Assistant:

bool CheckGrad(Model& m, ComputationGraph& g, int verbosity) {
  // Clear the parameters first
  const vector<Parameters*>& params = m.parameters_list();
  const vector<LookupParameters*>& lookup_params = m.lookup_parameters_list();
  for (auto pp : params)
    pp->clear();
  for (auto pp : lookup_params)
    pp->clear();

  // Perform forward and backward steps
  float alpha = 5e-4;
  g.forward();
  g.backward();

  // Check
  bool flag = false, curr_flag = false;
  for (auto pp : params) {
    if(verbosity > 1)
      cerr << endl << "PARAMETERS " << pp << endl;
    Parameters& p = *pp;
    size_t ts = p.dim.size();
    for (size_t i = 0; i < ts; ++i) {
      float old = TensorTools::AccessElement(p.values, i);
      TensorTools::SetElement(p.values, i, old - alpha);
      float E_left = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old + alpha);
      float E_right = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old);
      float g = (E_right - E_left) / (2 * alpha);
      float g_act = TensorTools::AccessElement(p.g, i);
      float f = fabs(g - g_act);
      float m = max(fabs(g), fabs(g_act));
      if (f > 0.1 && m > 0.f) f /= m;
      if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
      if(verbosity + (curr_flag ? 1 : 0) > 1) {
        cerr << g_act << ' ' << g << endl;
        curr_flag = false;
      }
    }
  }

  for (auto pp : lookup_params) {
    if(verbosity > 1)
      cerr << endl << "LOOKUP PARAMETERS " << pp << endl;
    LookupParameters& p = *pp;
    size_t ts = p.dim.size();
    for (unsigned j : p.non_zero_grads) {
      if(verbosity > 1)
        cerr << "OBJECT=" << j << endl;
      Tensor& v = p.values[j];
      Tensor& ag = p.grads[j];
      for (size_t i = 0; i < ts; ++i) {
        float old = TensorTools::AccessElement(v, i);
        TensorTools::SetElement(v, i, old - alpha);
        float E_left = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old + alpha);
        float E_right = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old);
        float g = (E_right - E_left) / (2 * alpha);
        float g_act = TensorTools::AccessElement(ag, i);
        float f = fabs(g - g_act);
        float m = max(fabs(g), fabs(g_act));
        if (f > 0.1 && m > 0.f) f /= m;
        if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
        if(verbosity + (curr_flag ? 1 : 0) > 1) {
          cerr << g_act << ' ' << g << endl;
          curr_flag = false;
        }
      }
    }
  }

  if (flag) {
    if (verbosity > 1)
      cerr << endl << "*** GRADIENT CHECK FAILED ***" << endl;
  } else {
    if (verbosity > 0)
      cerr << endl << "GRADIENT CHECK PASSED" << endl;
  }
  return !flag;
}